

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entdec.c
# Opt level: O3

int od_ec_decode_bool_q15(od_ec_dec *dec,uint f)

{
  od_ec_window dif;
  uint rng;
  od_ec_window dif_00;
  bool bVar1;
  
  dif = dec->dif;
  rng = ((f >> 6) * (uint)(dec->rng >> 8) >> 1) + 4;
  bVar1 = rng * 0x10000 <= dif;
  dif_00 = dif + rng * -0x10000;
  if (bVar1) {
    od_ec_dec_normalize(dec,dif_00,dec->rng - rng,dif_00);
  }
  else {
    od_ec_dec_normalize(dec,dif,rng,dif_00);
  }
  return (uint)!bVar1;
}

Assistant:

int od_ec_decode_bool_q15(od_ec_dec *dec, unsigned f) {
  od_ec_window dif;
  od_ec_window vw;
  unsigned r;
  unsigned r_new;
  unsigned v;
  int ret;
  assert(0 < f);
  assert(f < 32768U);
  dif = dec->dif;
  r = dec->rng;
  assert(dif >> (OD_EC_WINDOW_SIZE - 16) < r);
  assert(32768U <= r);
  v = ((r >> 8) * (uint32_t)(f >> EC_PROB_SHIFT) >> (7 - EC_PROB_SHIFT));
  v += EC_MIN_PROB;
  vw = (od_ec_window)v << (OD_EC_WINDOW_SIZE - 16);
  ret = 1;
  r_new = v;
  if (dif >= vw) {
    r_new = r - v;
    dif -= vw;
    ret = 0;
  }
  return od_ec_dec_normalize(dec, dif, r_new, ret);
}